

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

QVariant * __thiscall
StringListModel::data
          (QVariant *__return_storage_ptr__,StringListModel *this,QModelIndex *index,int role)

{
  QVariant baseData;
  QVariant QStack_48;
  QArrayDataPointer<char16_t> local_28;
  
  ::QStringListModel::data((QModelIndex *)&QStack_48,(int)this);
  QVariant::toString();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (local_28.size == 0) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QVariant::QVariant(__return_storage_ptr__,&QStack_48);
  }
  QVariant::~QVariant(&QStack_48);
  return __return_storage_ptr__;
}

Assistant:

QVariant data(const QModelIndex &index, int role = Qt::DisplayRole) const override
    {
        const QVariant baseData = QStringListModel::data(index, role);
        if (baseData.toString().isEmpty())
            return QVariant();
        return baseData;
    }